

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O2

string * cmQtAutoGen::Quoted(string *__return_storage_ptr__,string *text)

{
  long lVar1;
  char *pcStack_c8;
  array<std::pair<const_char_*,_const_char_*>,_9UL> replaces;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  replaces._M_elems[0].first = "\\";
  replaces._M_elems[0].second = "\\\\";
  replaces._M_elems[1].first = "\"";
  replaces._M_elems[1].second = "\\\"";
  replaces._M_elems[2].first = "\a";
  replaces._M_elems[2].second = "\\a";
  replaces._M_elems[3].first = anon_var_dwarf_eb0018 + 2;
  replaces._M_elems[3].second = "\\b";
  replaces._M_elems[4].first = "\f";
  replaces._M_elems[4].second = "\\f";
  replaces._M_elems[5].first = "\n";
  replaces._M_elems[5].second = "\\n";
  replaces._M_elems[6].first = "\r";
  replaces._M_elems[6].second = "\\r";
  replaces._M_elems[7].first = "\t";
  replaces._M_elems[7].second = "\\t";
  replaces._M_elems[8].first = "\v";
  replaces._M_elems[8].second = "\\v";
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)text);
  for (lVar1 = 8; lVar1 != 0x98; lVar1 = lVar1 + 0x10) {
    cmsys::SystemTools::ReplaceString
              (__return_storage_ptr__,*(char **)((long)&pcStack_c8 + lVar1),
               *(char **)((long)&replaces._M_elems[0].first + lVar1));
  }
  std::operator+(&local_30,'\"',__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(std::string const& text)
{
  const std::array<std::pair<const char*, const char*>, 9> replaces = {
    { { "\\", "\\\\" },
      { "\"", "\\\"" },
      { "\a", "\\a" },
      { "\b", "\\b" },
      { "\f", "\\f" },
      { "\n", "\\n" },
      { "\r", "\\r" },
      { "\t", "\\t" },
      { "\v", "\\v" } }
  };

  std::string res = text;
  for (auto const& pair : replaces) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  res = '"' + res;
  res += '"';
  return res;
}